

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

TRANSPORT_LL_HANDLE
IoTHubTransport_MQTT_Common_Create
          (IOTHUBTRANSPORT_CONFIG *config,MQTT_GET_IO_TRANSPORT get_io_transport,
          TRANSPORT_CALLBACKS_INFO *cb_info,void *ctx)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  size_t sVar3;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  size_t deviceIdSize;
  PMQTTTRANSPORT_HANDLE_DATA result;
  void *ctx_local;
  TRANSPORT_CALLBACKS_INFO *cb_info_local;
  MQTT_GET_IO_TRANSPORT get_io_transport_local;
  IOTHUBTRANSPORT_CONFIG *config_local;
  
  if (((config == (IOTHUBTRANSPORT_CONFIG *)0x0) || (get_io_transport == (MQTT_GET_IO_TRANSPORT)0x0)
      ) || (cb_info == (TRANSPORT_CALLBACKS_INFO *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_Create",0xc90,1,
                "Invalid Argument config: %p, get_io_transport: %p, cb_info: %p",config,
                get_io_transport,cb_info);
    }
    deviceIdSize = 0;
  }
  else if (config->auth_module_handle == (IOTHUB_AUTHORIZATION_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_Create",0xc95,1,
                "Invalid Argument: auth_module_handle is NULL)");
    }
    deviceIdSize = 0;
  }
  else if (((((config->upperConfig == (IOTHUB_CLIENT_CONFIG *)0x0) ||
             (config->upperConfig->protocol == (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0)) ||
            ((config->upperConfig->deviceId == (char *)0x0 ||
             ((config->upperConfig->deviceKey != (char *)0x0 &&
              (config->upperConfig->deviceSasToken != (char *)0x0)))))) ||
           (config->upperConfig->iotHubName == (char *)0x0)) ||
          (config->upperConfig->iotHubSuffix == (char *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_Create",0xc9f,1,
                "Invalid Argument: upperConfig structure contains an invalid parameter");
    }
    deviceIdSize = 0;
  }
  else if (config->waitingToSend == (PDLIST_ENTRY)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_Create",0xca4,1,
                "Invalid Argument: waitingToSend is NULL)");
    }
    deviceIdSize = 0;
  }
  else {
    sVar3 = strlen(config->upperConfig->deviceId);
    if ((sVar3 < 0x81) && (sVar3 != 0)) {
      if ((config->upperConfig->deviceKey == (char *)0x0) ||
         (sVar3 = strlen(config->upperConfig->deviceKey), sVar3 != 0)) {
        if ((config->upperConfig->deviceSasToken == (char *)0x0) ||
           (sVar3 = strlen(config->upperConfig->deviceSasToken), sVar3 != 0)) {
          sVar3 = strlen(config->upperConfig->iotHubName);
          if (sVar3 == 0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                        ,"IoTHubTransport_MQTT_Common_Create",0xcb8,1,
                        "Invalid Argument: iotHubName is empty");
            }
            deviceIdSize = 0;
          }
          else {
            iVar1 = IoTHub_Transport_ValidateCallbacks(cb_info);
            if (iVar1 == 0) {
              deviceIdSize = (size_t)InitializeTransportHandleData
                                               (config->upperConfig,config->waitingToSend,
                                                config->auth_module_handle,config->moduleId);
              if ((PMQTTTRANSPORT_HANDLE_DATA)deviceIdSize != (PMQTTTRANSPORT_HANDLE_DATA)0x0) {
                ((PMQTTTRANSPORT_HANDLE_DATA)deviceIdSize)->get_io_transport = get_io_transport;
                ((PMQTTTRANSPORT_HANDLE_DATA)deviceIdSize)->http_proxy_hostname = (char *)0x0;
                ((PMQTTTRANSPORT_HANDLE_DATA)deviceIdSize)->http_proxy_username = (char *)0x0;
                ((PMQTTTRANSPORT_HANDLE_DATA)deviceIdSize)->http_proxy_password = (char *)0x0;
                ((PMQTTTRANSPORT_HANDLE_DATA)deviceIdSize)->transport_ctx = ctx;
                memcpy(&((PMQTTTRANSPORT_HANDLE_DATA)deviceIdSize)->transport_callbacks,cb_info,0x48
                      );
              }
            }
            else {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                          ,"IoTHubTransport_MQTT_Common_Create",0xcbd,1,
                          "failure checking transport callbacks");
              }
              deviceIdSize = 0;
            }
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                      ,"IoTHubTransport_MQTT_Common_Create",0xcb3,1,
                      "Invalid Argument: deviceSasToken is empty");
          }
          deviceIdSize = 0;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                    ,"IoTHubTransport_MQTT_Common_Create",0xcae,1,
                    "Invalid Argument: deviceKey is empty");
        }
        deviceIdSize = 0;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                  ,"IoTHubTransport_MQTT_Common_Create",0xca9,1,
                  "Invalid Argument: DeviceId is of an invalid size");
      }
      deviceIdSize = 0;
    }
  }
  return (TRANSPORT_LL_HANDLE)deviceIdSize;
}

Assistant:

TRANSPORT_LL_HANDLE IoTHubTransport_MQTT_Common_Create(const IOTHUBTRANSPORT_CONFIG* config, MQTT_GET_IO_TRANSPORT get_io_transport, TRANSPORT_CALLBACKS_INFO* cb_info, void* ctx)
{
    PMQTTTRANSPORT_HANDLE_DATA result;
    size_t deviceIdSize;

    if (config == NULL || get_io_transport == NULL || cb_info == NULL)
    {
        LogError("Invalid Argument config: %p, get_io_transport: %p, cb_info: %p", config, get_io_transport, cb_info);
        result = NULL;
    }
    else if (config->auth_module_handle == NULL)
    {
        LogError("Invalid Argument: auth_module_handle is NULL)");
        result = NULL;
    }
    else if (config->upperConfig == NULL ||
        config->upperConfig->protocol == NULL ||
        config->upperConfig->deviceId == NULL ||
        ((config->upperConfig->deviceKey != NULL) && (config->upperConfig->deviceSasToken != NULL)) ||
        config->upperConfig->iotHubName == NULL ||
        config->upperConfig->iotHubSuffix == NULL)
    {
        LogError("Invalid Argument: upperConfig structure contains an invalid parameter");
        result = NULL;
    }
    else if (config->waitingToSend == NULL)
    {
        LogError("Invalid Argument: waitingToSend is NULL)");
        result = NULL;
    }
    else if (((deviceIdSize = strlen(config->upperConfig->deviceId)) > 128U) || (deviceIdSize == 0))
    {
        LogError("Invalid Argument: DeviceId is of an invalid size");
        result = NULL;
    }
    else if ((config->upperConfig->deviceKey != NULL) && (strlen(config->upperConfig->deviceKey) == 0))
    {
        LogError("Invalid Argument: deviceKey is empty");
        result = NULL;
    }
    else if ((config->upperConfig->deviceSasToken != NULL) && (strlen(config->upperConfig->deviceSasToken) == 0))
    {
        LogError("Invalid Argument: deviceSasToken is empty");
        result = NULL;
    }
    else if (strlen(config->upperConfig->iotHubName) == 0)
    {
        LogError("Invalid Argument: iotHubName is empty");
        result = NULL;
    }
    else if (IoTHub_Transport_ValidateCallbacks(cb_info) != 0)
    {
        LogError("failure checking transport callbacks");
        result = NULL;
    }
    else
    {
        result = InitializeTransportHandleData(config->upperConfig, config->waitingToSend, config->auth_module_handle, config->moduleId);
        if (result != NULL)
        {
            result->get_io_transport = get_io_transport;
            result->http_proxy_hostname = NULL;
            result->http_proxy_username = NULL;
            result->http_proxy_password = NULL;

            result->transport_ctx = ctx;
            memcpy(&result->transport_callbacks, cb_info, sizeof(TRANSPORT_CALLBACKS_INFO));
        }
    }
    return result;
}